

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall
FFontChar2::FFontChar2
          (FFontChar2 *this,int sourcelump,int sourcepos,int width,int height,int leftofs,int topofs
          )

{
  SWORD local_24;
  WORD local_20;
  int leftofs_local;
  int height_local;
  int width_local;
  int sourcepos_local;
  int sourcelump_local;
  FFontChar2 *this_local;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FFontChar2_009fd3c8;
  *(int *)&(this->super_FTexture).field_0x54 = sourcelump;
  this->SourcePos = sourcepos;
  this->Pixels = (BYTE *)0x0;
  this->Spans = (Span **)0x0;
  this->SourceRemap = (BYTE *)0x0;
  (this->super_FTexture).UseType = '\t';
  leftofs_local._0_2_ = (WORD)width;
  (this->super_FTexture).Width = (WORD)leftofs_local;
  local_20 = (WORD)height;
  (this->super_FTexture).Height = local_20;
  local_24 = (SWORD)leftofs;
  (this->super_FTexture).LeftOffset = local_24;
  (this->super_FTexture).TopOffset = (SWORD)topofs;
  FTexture::CalcBitSize(&this->super_FTexture);
  return;
}

Assistant:

FFontChar2::FFontChar2 (int sourcelump, int sourcepos, int width, int height, int leftofs, int topofs)
: SourceLump (sourcelump), SourcePos (sourcepos), Pixels (0), Spans (0), SourceRemap(NULL)
{
	UseType = TEX_FontChar;
	Width = width;
	Height = height;
	LeftOffset = leftofs;
	TopOffset = topofs;
	CalcBitSize ();
}